

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_free_snap_markers(fdb_snapshot_info_t *markers,uint64_t size)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  
  if (size != 0 && markers != (fdb_snapshot_info_t *)0x0) {
    for (uVar3 = 0; uVar3 != size; uVar3 = uVar3 + 1) {
      lVar2 = markers[uVar3].num_kvs_markers;
      if (lVar2 != 0) {
        lVar1 = lVar2 << 4;
        for (; 0 < lVar2; lVar2 = lVar2 + -1) {
          free(*(void **)((long)&markers[uVar3].kvs_markers[-1].kv_store_name + lVar1));
          lVar1 = lVar1 + -0x10;
        }
        free(markers[uVar3].kvs_markers);
      }
    }
    free(markers);
    return FDB_RESULT_SUCCESS;
  }
  return FDB_RESULT_INVALID_ARGS;
}

Assistant:

LIBFDB_API
fdb_status fdb_free_snap_markers(fdb_snapshot_info_t *markers, uint64_t size) {
    uint64_t i;
    int64_t kvs_idx;
    if (!markers || !size) {
        return FDB_RESULT_INVALID_ARGS;
    }
    for (i = 0; i < size; ++i) {
        kvs_idx = markers[i].num_kvs_markers;
        if (kvs_idx) {
            for (kvs_idx = kvs_idx - 1; kvs_idx >=0; --kvs_idx) {
                free(markers[i].kvs_markers[kvs_idx].kv_store_name);
            }
            free(markers[i].kvs_markers);
        }
    }
    free(markers);
    return FDB_RESULT_SUCCESS;
}